

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproperty_p.h
# Opt level: O2

void QPropertyBindingPrivate::destroyAndFreeMemory(QPropertyBindingPrivate *priv)

{
  if (priv->vtable->size != 0) {
    ~QPropertyBindingPrivate(priv);
    operator_delete__(priv);
    return;
  }
  (*priv->vtable->destroy)(priv);
  return;
}

Assistant:

static void destroyAndFreeMemory(QPropertyBindingPrivate *priv) {
        if (priv->hasCustomVTable()) {
            // special hack for QQmlPropertyBinding which has a
            // different memory layout than normal QPropertyBindings
            priv->vtable->destroy(priv);
        } else{
            priv->~QPropertyBindingPrivate();
            delete[] reinterpret_cast<std::byte *>(priv);
        }
    }